

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarIntG8IU.h
# Opt level: O1

string * __thiscall
FastPForLib::VarIntG8IU::name_abi_cxx11_(string *__return_storage_ptr__,VarIntG8IU *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"VarIntG8IU","");
  return __return_storage_ptr__;
}

Assistant:

virtual std::string name() const { return std::string("VarIntG8IU"); }